

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting.cpp
# Opt level: O3

void __thiscall
scripting_interface::anon_unknown_1::ScriptClass::add_function
          (ScriptClass *this,char *name,SQFUNCTION function)

{
  HSQUIRRELVM *ppSVar1;
  HSQUIRRELVM v;
  size_t len;
  SQRESULT SVar2;
  HSQOBJECT obj;
  ScopedValidateTop top;
  ScopedValidateTop local_30;
  
  ppSVar1 = this->_v;
  local_30._start_top = sq_gettop(*ppSVar1);
  obj._4_4_ = 0;
  obj._type = (this->_class_object)._type;
  obj._unVal.pTable = (this->_class_object)._unVal.pTable;
  local_30._v = ppSVar1;
  sq_pushobject(*this->_v,obj);
  v = *this->_v;
  len = strlen(name);
  sq_pushstring(v,name,len);
  sq_newclosure(*this->_v,function,0);
  SVar2 = sq_newslot(*this->_v,-3,0);
  if (SVar2 == 0) {
    sq_pop(*this->_v,1);
    ScopedValidateTop::~ScopedValidateTop(&local_30);
    return;
  }
  __assert_fail("result == (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/scripting.cpp"
                ,0x2c,"void scripting_interface::(anonymous namespace)::check_return(SQRESULT)");
}

Assistant:

void add_function(const char * const name, SQFUNCTION function) {
				ScopedValidateTop top(_v);
				sq_pushobject(_v, _class_object);
				sq_pushstring(_v, name, strlen(name));
				sq_newclosure(_v, function, 0);
				check_return(sq_newslot(_v, -3, SQFalse));
				sq_pop(_v, 1);
			}